

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  uint _c;
  _func_int **pp_Var11;
  _func_int *p_Var12;
  _func_int *p_Var13;
  Layer *pLVar14;
  int outch;
  undefined8 *puVar15;
  int i;
  int _h;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  Mat *kernel_tm;
  int iVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ModelBinFromMatArray local_a20;
  int local_a10;
  int local_a0c;
  ulong local_a08;
  ulong local_a00;
  Mat *local_9f8;
  _func_int *local_9f0;
  Convolution_x86 *local_9e8;
  long local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  int *local_9c8;
  ulong local_9c0;
  Mat weights [2];
  ParamDict pd;
  
  switch(*(undefined4 *)
          (this->_vptr_Convolution_x86[-3] + 0x34 +
          (long)&(this->weight_3x3_winograd23_data_int8).data)) {
  case 1:
    pLVar14 = create_layer(0x1a);
    this->activation = pLVar14;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 2:
    pLVar14 = create_layer(0x1a);
    this->activation = pLVar14;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           (this->_vptr_Convolution_x86[-3] + 0x38 +
                           (long)&(this->weight_3x3_winograd23_data_int8).data));
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 3:
    pLVar14 = create_layer(0x36);
    this->activation = pLVar14;
    ParamDict::ParamDict(&pd);
    p_Var12 = this->_vptr_Convolution_x86[-3];
    if ((&this->field_0x200)[(long)p_Var12] == '\x01') {
      ParamDict::set(&pd,0,**(float **)
                             (p_Var12 + 0x38 + (long)&(this->weight_3x3_winograd23_data_int8).data)
                           * *(float *)(&this->field_0x1fc + (long)p_Var12));
      fVar22 = *(float *)(&this->field_0x1fc + (long)this->_vptr_Convolution_x86[-3]) *
               *(float *)(*(long *)(this->_vptr_Convolution_x86[-3] + 0x38 +
                                   (long)&(this->weight_3x3_winograd23_data_int8).data) + 4);
    }
    else {
      ParamDict::set(&pd,0,**(float **)
                             (p_Var12 + 0x38 + (long)&(this->weight_3x3_winograd23_data_int8).data))
      ;
      fVar22 = *(float *)(*(long *)(this->_vptr_Convolution_x86[-3] + 0x38 +
                                   (long)&(this->weight_3x3_winograd23_data_int8).data) + 4);
    }
    ParamDict::set(&pd,1,fVar22);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 4:
    pLVar14 = create_layer(0x1e);
    this->activation = pLVar14;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  default:
    goto switchD_0012539e_default;
  }
  ParamDict::~ParamDict(&pd);
switchD_0012539e_default:
  pLVar14 = this->activation;
  if (pLVar14 != (Layer *)0x0) {
    (*pLVar14->_vptr_Layer[4])(pLVar14,opt);
  }
  pp_Var11 = this->_vptr_Convolution_x86;
  p_Var12 = pp_Var11[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x148 + (long)p_Var12) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar20 = *(int *)(p_Var12 + (long)&(this->weight_3x3_winograd23_data_int8).data) *
             *(int *)(&this->field_0xbc + (long)p_Var12);
    uVar18 = (long)((ulong)(uint)((int)((long)*(int *)(p_Var12 + 0x2c +
                                                      (long)&(this->weight_3x3_winograd23_data_int8)
                                                             .data) / (long)iVar20) >> 0x1f) << 0x20
                   | (long)*(int *)(p_Var12 + 0x2c +
                                   (long)&(this->weight_3x3_winograd23_data_int8).data) /
                     (long)iVar20 & 0xffffffffU) /
             (long)*(int *)(&this->use_winograd3x3_int8 + (long)p_Var12);
    uVar19 = uVar18 & 0xffffffff;
    this->use_winograd3x3 = false;
    p_Var13 = pp_Var11[-3];
    p_Var12 = (_func_int *)((long)&this->_vptr_Convolution_x86 + (long)p_Var13);
    if (((*(int *)(&this->field_0xbc + (long)p_Var13) ==
          *(int *)(p_Var13 + (long)&(this->weight_3x3_winograd23_data_int8).data)) &&
        (((*(int *)(p_Var12 + 0xc4) != 1 && (*(int *)(p_Var12 + 200) == *(int *)(p_Var12 + 0xc4)))
         && (*(int *)(p_Var12 + 0xcc) == 1)))) && (*(int *)(p_Var12 + 0xd0) == 1)) {
      pLVar14 = create_layer(6);
      this->convolution_dilation1 = pLVar14;
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,*(int *)(&this->use_winograd3x3_int8 +
                                   (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&pd,1,*(int *)(&this->field_0xbc + (long)this->_vptr_Convolution_x86[-3]));
      ParamDict::set(&pd,0xb,*(int *)(this->_vptr_Convolution_x86[-3] +
                                     (long)&(this->weight_3x3_winograd23_data_int8).data));
      ParamDict::set(&pd,2,1);
      ParamDict::set(&pd,0xc,1);
      ParamDict::set(&pd,3,1);
      ParamDict::set(&pd,0xd,1);
      ParamDict::set(&pd,4,0);
      ParamDict::set(&pd,0xe,0);
      ParamDict::set(&pd,5,*(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                                   (long)&(this->weight_3x3_winograd23_data_int8).data));
      ParamDict::set(&pd,6,*(int *)(this->_vptr_Convolution_x86[-3] + 0x2c +
                                   (long)&(this->weight_3x3_winograd23_data_int8).data));
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd);
      p_Var12 = this->_vptr_Convolution_x86[-3];
      if (*(int *)(p_Var12 + 0x28 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 0) {
        weights[0].elemsize._0_4_ = 0;
        weights[0]._20_8_ = 0;
        weights[0].data = (void *)0x0;
        weights[0].refcount._0_4_ = 0;
        weights[0].refcount._4_4_ = 0;
        weights[0].allocator = (Allocator *)0x0;
        weights[0].dims = 0;
        weights[0].w = 0;
        weights[0].h = 0;
        weights[0].c = 0;
        weights[0].cstep = 0;
        Mat::operator=(weights,(Mat *)(&this->field_0x138 + (long)p_Var12));
        pLVar14 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_a20,weights);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_a20);
        ModelBin::~ModelBin(&local_a20.super_ModelBin);
        Mat::~Mat(weights);
      }
      else {
        weights[0].elemsize._0_4_ = 0;
        weights[0]._20_8_ = 0;
        weights[0].data = (void *)0x0;
        weights[0].refcount._0_4_ = 0;
        weights[0].refcount._4_4_ = 0;
        weights[1].allocator = (Allocator *)0x0;
        weights[1].dims = 0;
        weights[1].w = 0;
        weights[1].h = 0;
        weights[1].c = 0;
        weights[1].cstep = 0;
        weights[0].allocator = (Allocator *)0x0;
        weights[0].dims = 0;
        weights[0].w = 0;
        weights[0].h = 0;
        weights[0].c = 0;
        weights[0].cstep = 0;
        weights[1].data = (void *)0x0;
        weights[1].refcount._0_4_ = 0;
        weights[1].refcount._4_4_ = 0;
        weights[1].elemsize._0_4_ = 0;
        weights[1]._20_8_ = 0;
        Mat::operator=(weights,(Mat *)(&this->field_0x138 + (long)p_Var12));
        Mat::operator=(weights + 1,
                       (Mat *)(&this->field_0x178 + (long)this->_vptr_Convolution_x86[-3]));
        pLVar14 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_a20,weights);
        (*pLVar14->_vptr_Layer[3])(pLVar14,&local_a20);
        ModelBin::~ModelBin(&local_a20.super_ModelBin);
        lVar17 = 0x40;
        do {
          Mat::~Mat((Mat *)((long)&weights[0].data + lVar17));
          lVar17 = lVar17 + -0x40;
        } while (lVar17 != -0x40);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      ParamDict::~ParamDict(&pd);
    }
    else {
      _h = (int)uVar18;
      if ((((*(int *)(p_Var13 + (long)&(this->weight_3x3_winograd23_data_int8).data) == 3) &&
           (*(int *)(&this->field_0xbc + (long)p_Var13) == 3)) &&
          ((opt->use_winograd_convolution != false &&
           ((*(int *)(p_Var12 + 0xc4) == 1 && (*(int *)(p_Var12 + 200) == 1)))))) &&
         ((*(int *)(p_Var12 + 0xcc) == 1 &&
          (((*(int *)(p_Var12 + 0xd0) == 1 && (0xf < _h)) && (0xf < *(int *)(p_Var12 + 0xb8))))))) {
        this->use_winograd3x3 = true;
        local_9f0 = pp_Var11[-3];
        local_9f8 = &this->weight_3x3_winograd23_data;
        _c = *(uint *)(&this->use_winograd3x3_int8 + (long)local_9f0);
        uVar18 = 0;
        local_a10 = iVar20;
        Mat::create(local_9f8,0x10,_h,_c,4,(Allocator *)0x0);
        local_a0c = _h * 9;
        local_a08 = uVar19;
        local_a00 = (ulong)_c;
        local_9e8 = this;
        local_9d0 = uVar19;
        if ((int)_c < 1) {
          local_a00 = uVar18;
        }
        while (uVar18 != local_a00) {
          local_9e0 = (long)(local_a0c * (int)uVar18) << 2;
          uVar19 = 0;
          local_9d8 = uVar18;
          while (uVar19 != local_9d0) {
            lVar17 = *(long *)(&this->field_0x138 + (long)local_9f0) + local_9e0;
            lVar21 = uVar19 * 0x24;
            local_9c0 = uVar19;
            Mat::channel((Mat *)&pd,local_9f8,(int)local_9d8);
            iVar20 = pd.params[0].v.allocator._4_4_;
            uVar10 = pd.params[0]._0_8_;
            local_9c8 = pd.params[0].v.refcount;
            Mat::~Mat((Mat *)&pd);
            fVar22 = *(float *)(lVar21 + 0x18 + lVar17);
            fVar1 = *(float *)(lVar21 + 0x1c + lVar17);
            fVar2 = *(float *)(lVar21 + 0x20 + lVar17);
            fVar3 = *(float *)(lVar21 + 0x10 + lVar17);
            fVar4 = *(float *)(lVar21 + lVar17);
            fVar5 = *(float *)(lVar21 + 4 + lVar17);
            fVar6 = *(float *)(lVar21 + 8 + lVar17);
            fVar7 = *(float *)(lVar21 + 0xc + lVar17);
            fVar8 = *(float *)(lVar21 + 0x14 + lVar17);
            for (lVar17 = 8; lVar17 != 0x38; lVar17 = lVar17 + 0xc) {
              fVar9 = *(float *)((long)&DAT_00163510 + lVar17);
              fVar23 = (float)*(undefined8 *)("N4ncnn15Convolution_x86E" + lVar17 + 0x18);
              fVar24 = (float)((ulong)*(undefined8 *)("N4ncnn15Convolution_x86E" + lVar17 + 0x18) >>
                              0x20);
              *(ulong *)((long)&weights[1].cstep + lVar17) =
                   CONCAT44(fVar9 * fVar8 + fVar24 * fVar3 + fVar23 * fVar7,
                            fVar9 * fVar6 + fVar23 * fVar4 + fVar24 * fVar5);
              *(float *)((long)&pd.params[0].type + lVar17) =
                   fVar9 * fVar2 + fVar23 * fVar22 + fVar24 * fVar1;
            }
            lVar21 = uVar10 + (long)local_9c8 * (long)(iVar20 * (int)local_9c0);
            for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
              fVar22 = (float)(&pd.params[0].type)[lVar17 * 3];
              uVar10 = *(undefined8 *)(&pd.params[0].field_1 + lVar17 * 3);
              puVar15 = &DAT_00163514;
              for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                *(float *)(lVar21 + lVar16 * 4) =
                     (float)((ulong)*puVar15 >> 0x20) * (float)((ulong)uVar10 >> 0x20) +
                     *(float *)((long)puVar15 + -4) * fVar22 + (float)*puVar15 * (float)uVar10;
                puVar15 = (undefined8 *)((long)puVar15 + 0xc);
              }
              lVar21 = lVar21 + 0x10;
            }
            this = local_9e8;
            uVar19 = local_9c0 + 1;
          }
          uVar18 = local_9d8 + 1;
        }
        p_Var12 = (_func_int *)
                  ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
        kernel_tm = &this->weight_sgemm_data;
        outch = *(int *)(p_Var12 + 0xb8);
        _h = (int)local_a08;
        iVar20 = local_a10;
      }
      else {
        kernel_tm = &this->weight_sgemm_data;
        outch = *(int *)(p_Var12 + 0xb8);
      }
      conv_im2col_sgemm_transform_kernel_sse((Mat *)(p_Var12 + 0x138),kernel_tm,_h,outch,iVar20);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        if (use_int8_requantize)
        {
            pd.set(0, activation_params[0] * top_blob_int8_scale);// min
            pd.set(1, activation_params[1] * top_blob_int8_scale);// max
        }else{
            pd.set(0, activation_params[0]);// min
            pd.set(1, activation_params[1]);// max
        }

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    use_winograd3x3 = false;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);// stride_w
        pd.set(13, 1);// stride_h
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);
    }
    else if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1
        && num_input >= 16 && num_output >= 16)
    {
        // winograd is slow on small channel count
        use_winograd3x3 = true;

        conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
//         conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd43_data, num_input, num_output);

        // for small size
        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }
    else
    {
        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }

    return 0;
}